

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O1

void __thiscall
arealights::LinearlyTransformedCosines::~LinearlyTransformedCosines
          (LinearlyTransformedCosines *this)

{
  Texture *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
            (&this->_lights);
  pTVar1 = (this->_ltcLookupMatB)._M_t.
           super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
           super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
           super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl;
  if (pTVar1 != (Texture *)0x0) {
    (*pTVar1->_vptr_Texture[1])();
  }
  (this->_ltcLookupMatB)._M_t.super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>.
  _M_t.super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
  super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl = (Texture *)0x0;
  pTVar1 = (this->_ltcLookupMatA)._M_t.
           super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
           super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
           super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl;
  if (pTVar1 != (Texture *)0x0) {
    (*pTVar1->_vptr_Texture[1])();
  }
  (this->_ltcLookupMatA)._M_t.super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>.
  _M_t.super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
  super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl = (Texture *)0x0;
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            (&this->_ltcShader);
  this_00 = (this->_renderHelper).
            super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

LinearlyTransformedCosines::~LinearlyTransformedCosines()
{
}